

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall
soplex::SPxSolverBase<double>::precisionReached(SPxSolverBase<double> *this,double *newpricertol)

{
  double dVar1;
  double dVar2;
  SPxOut *pSVar3;
  Real RVar4;
  double extraout_XMM0_Qa;
  double t;
  double maxViolConst;
  double maxViolBounds;
  double sumViolConst;
  double sumViolBounds;
  double sumViolRedCost;
  double maxViolRedCost;
  Verbosity old_verbosity;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  undefined4 local_28;
  Verbosity local_24;
  
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x72])(this,&local_30,&local_38);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x70])(this,&local_50,&local_40);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6f])(this,&local_58,&local_48);
  dVar1 = local_30;
  RVar4 = Tolerances::floatingPointOpttol
                    ((this->super_SPxLPBase<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  dVar2 = local_50;
  if (((dVar1 < RVar4) &&
      (RVar4 = Tolerances::floatingPointFeastol
                         ((this->super_SPxLPBase<double>)._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      , dVar1 = local_58, dVar2 < RVar4)) &&
     (RVar4 = Tolerances::floatingPointFeastol
                        ((this->super_SPxLPBase<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     dVar1 < RVar4)) {
    return true;
  }
  (*this->thepricer->_vptr_SPxPricer[5])();
  *newpricertol = extraout_XMM0_Qa / 10.0;
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (local_24 = pSVar3->m_verbosity, 4 < (int)local_24)) {
    local_28 = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = soplex::operator<<(this->spxout,"Precision not reached: Pricer tolerance = ");
    (*this->thepricer->_vptr_SPxPricer[5])();
    pSVar3 = soplex::operator<<(pSVar3,t);
    pSVar3 = soplex::operator<<(pSVar3," new tolerance = ");
    pSVar3 = soplex::operator<<(pSVar3,*newpricertol);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    pSVar3 = soplex::operator<<(pSVar3," maxViolRedCost= ");
    pSVar3 = soplex::operator<<(pSVar3,local_30);
    pSVar3 = soplex::operator<<(pSVar3," maxViolBounds= ");
    pSVar3 = soplex::operator<<(pSVar3,local_50);
    pSVar3 = soplex::operator<<(pSVar3," maxViolConst= ");
    pSVar3 = soplex::operator<<(pSVar3,local_58);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    pSVar3 = soplex::operator<<(pSVar3," sumViolRedCost= ");
    pSVar3 = soplex::operator<<(pSVar3,local_38);
    pSVar3 = soplex::operator<<(pSVar3," sumViolBounds= ");
    pSVar3 = soplex::operator<<(pSVar3,local_40);
    pSVar3 = soplex::operator<<(pSVar3," sumViolConst= ");
    pSVar3 = soplex::operator<<(pSVar3,local_48);
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_24);
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}